

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidy.c
# Opt level: O3

void xml_strings(void)

{
  uint code;
  int iVar1;
  ctmbstr ptVar2;
  ctmbstr __s2;
  char *pcVar3;
  bool bVar4;
  TidyIterator j;
  TidyIterator local_38;
  
  ptVar2 = tidyGetLanguage();
  if ((*ptVar2 == 'e') && (ptVar2[1] == 'n')) {
    bVar4 = ptVar2[2] == '\0';
  }
  else {
    bVar4 = false;
  }
  ptVar2 = tidyLibraryVersion();
  printf("<?xml version=\"1.0\"?>\n<localized_strings version=\"%s\">\n",ptVar2);
  local_38 = getStringKeyList();
  while (local_38 != (TidyIterator)0x0) {
    code = getNextStringKey(&local_38);
    ptVar2 = tidyErrorCodeAsKey(code);
    iVar1 = strcmp(ptVar2,"UNDEFINED");
    if (iVar1 == 0) {
      ptVar2 = "";
    }
    printf("<localized_string id=\"%u\" label=\"%s\">\n",(ulong)code,ptVar2);
    printf(" <string class=\"%s\">","en");
    ptVar2 = tidyDefaultString(code);
    printf(anon_var_dwarf_1a363 + 0x16,ptVar2);
    puts("</string>");
    if (!bVar4) {
      ptVar2 = tidyLocalizedString(code);
      __s2 = tidyDefaultString(code);
      iVar1 = strcmp(ptVar2,__s2);
      ptVar2 = tidyGetLanguage();
      pcVar3 = "no";
      if (iVar1 == 0) {
        pcVar3 = "yes";
      }
      printf(" <string class=\"%s\" same_as_base=\"%s\">",ptVar2,pcVar3);
      ptVar2 = tidyLocalizedString(code);
      printf(anon_var_dwarf_1a363 + 0x16,ptVar2);
      puts("</string>");
    }
    puts("</localized_string>");
  }
  puts("</localized_strings>");
  return;
}

Assistant:

static void xml_strings( void )
{
    uint i;
    TidyIterator j;

    ctmbstr current_language = tidyGetLanguage();
    ctmbstr current_label;
    Bool skip_current = strcmp( current_language, "en" ) == 0;
    Bool matches_base;

    printf( "<?xml version=\"1.0\"?>\n"
           "<localized_strings version=\"%s\">\n", tidyLibraryVersion());

    j = getStringKeyList();
    while (j) {
        i = getNextStringKey(&j);
        current_label = tidyErrorCodeAsKey(i);
        if (!strcmp(current_label, "UNDEFINED"))
            current_label = "";
        printf( "<localized_string id=\"%u\" label=\"%s\">\n", i, current_label );
        printf( " <string class=\"%s\">", "en" );
        printf("%s", tidyDefaultString(i));
        printf( "</string>\n" );
        if ( !skip_current ) {
            matches_base = strcmp( tidyLocalizedString(i), tidyDefaultString(i) ) == 0;
            printf( " <string class=\"%s\" same_as_base=\"%s\">", tidyGetLanguage(), matches_base ? "yes" : "no" );
            printf("%s", tidyLocalizedString(i));
            printf( "</string>\n" );
        }
        printf( "</localized_string>\n");
    }

    printf( "</localized_strings>\n" );
}